

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O0

Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readMapping_abi_cxx11_
          (Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  YamlEvent *pYVar3;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *__args_1;
  Mapping *__args_1_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_bool>
  pVar4;
  string local_300;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  undefined1 local_290 [8];
  Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_1;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  undefined1 local_228 [8];
  Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  undefined1 local_1f0 [8];
  YamlEvent event_1;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  undefined1 local_188 [8];
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result_1;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  undefined1 local_118 [8];
  YamlEvent event;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  undefined1 local_98 [8];
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  string key;
  Mapping mapping;
  ParserContext *this_local;
  
  Mapping::Mapping((Mapping *)((long)&key.field_2 + 8));
  do {
    std::__cxx11::string::string((string *)&event_result.has_value_);
    getNextEvent_abi_cxx11_
              ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98,this);
    bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_98);
    if (bVar1) {
      pYVar3 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_98);
      YamlEvent::YamlEvent((YamlEvent *)local_118,pYVar3);
      if (local_118._0_4_ == YAML_SCALAR_EVENT) {
        std::__cxx11::string::operator=((string *)&event_result.has_value_,(string *)&event);
        event.value.field_2._12_4_ = 0;
      }
      else if (local_118._0_4_ == YAML_MAPPING_END_EVENT) {
        Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(Mapping *)((long)&key.field_2 + 8));
        event.value.field_2._12_4_ = 1;
      }
      else {
        format_abi_cxx11_((string *)&event_result_1.has_value_,"Unexpected event %d",
                          (ulong)(uint)local_118._0_4_);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &event_result_1.has_value_);
        Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_138);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_138);
        std::__cxx11::string::~string((string *)&event_result_1.has_value_);
        event.value.field_2._12_4_ = 1;
      }
      YamlEvent::~YamlEvent((YamlEvent *)local_118);
    }
    else {
      pbVar2 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_98);
      std::operator+(&local_e8,"Error while reading mapping: ",pbVar2);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Unexpected(&local_c8,&local_e8);
      Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,&local_c8);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Unexpected(&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      event.value.field_2._12_4_ = 1;
    }
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_98);
    if (event.value.field_2._12_4_ == 0) {
      getNextEvent_abi_cxx11_
                ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_188,this);
      bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_188);
      if (bVar1) {
        pYVar3 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_188);
        YamlEvent::YamlEvent((YamlEvent *)local_1f0,pYVar3);
        if (local_1f0._0_4_ == YAML_SCALAR_EVENT) {
          pVar4 = std::
                  map<std::__cxx11::string,yaml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                  ::emplace<std::__cxx11::string,std::__cxx11::string>
                            ((map<std::__cxx11::string,yaml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                              *)(key.field_2._M_local_buf + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &event_result.has_value_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &event_1);
          result._32_8_ = pVar4.first._M_node;
LAB_0019b88a:
          event.value.field_2._12_4_ = 0;
        }
        else if (local_1f0._0_4_ == YAML_SEQUENCE_START_EVENT) {
          readSequence_abi_cxx11_
                    ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_228,this);
          bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_228);
          if (bVar1) {
            __args_1 = Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::value((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_228);
            pVar4 = std::
                    map<std::__cxx11::string,yaml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                    ::
                    emplace<std::__cxx11::string,std::vector<yaml::Value,std::allocator<yaml::Value>>>
                              ((map<std::__cxx11::string,yaml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                                *)(key.field_2._M_local_buf + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &event_result.has_value_,__args_1);
            result_1._48_8_ = pVar4.first._M_node;
          }
          else {
            pbVar2 = Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_228);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Unexpected(&local_248,pbVar2);
            Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,&local_248);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Unexpected(&local_248);
          }
          event.value.field_2._13_3_ = 0;
          event.value.field_2._M_local_buf[0xc] = !bVar1;
          Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_228);
joined_r0x0019b658:
          if (event.value.field_2._12_4_ == 0) goto LAB_0019b88a;
        }
        else {
          if (local_1f0._0_4_ == YAML_MAPPING_START_EVENT) {
            readMapping_abi_cxx11_
                      ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_290,this);
            bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_290);
            if (bVar1) {
              __args_1_00 = Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::value((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_290);
              pVar4 = std::
                      map<std::__cxx11::string,yaml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                      ::emplace<std::__cxx11::string,yaml::Mapping>
                                ((map<std::__cxx11::string,yaml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                                  *)(key.field_2._M_local_buf + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&event_result.has_value_,__args_1_00);
              local_2c0 = (_Base_ptr)pVar4.first._M_node;
              local_2b8 = pVar4.second;
            }
            else {
              pbVar2 = Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::error((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_290);
              Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Unexpected(&local_2b0,pbVar2);
              Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(__return_storage_ptr__,&local_2b0);
              Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Unexpected(&local_2b0);
            }
            event.value.field_2._13_3_ = 0;
            event.value.field_2._M_local_buf[0xc] = !bVar1;
            Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_290);
            goto joined_r0x0019b658;
          }
          format_abi_cxx11_(&local_300,"Unexpected event %d",(ulong)(uint)local_1f0._0_4_);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Unexpected(&local_2e0,&local_300);
          Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,&local_2e0);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Unexpected(&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          event.value.field_2._12_4_ = 1;
        }
        YamlEvent::~YamlEvent((YamlEvent *)local_1f0);
      }
      else {
        pbVar2 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::error((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_188);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&event_1.value.field_2 + 8),"Error while reading mapping: ",pbVar2);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&event_1.value.field_2 + 8));
        Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_1a8);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_1a8);
        std::__cxx11::string::~string((string *)(event_1.value.field_2._M_local_buf + 8));
        event.value.field_2._12_4_ = 1;
      }
      Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_188);
      if (event.value.field_2._12_4_ == 0) {
        event.value.field_2._12_4_ = 0;
      }
    }
    std::__cxx11::string::~string((string *)&event_result.has_value_);
    if (event.value.field_2._12_4_ != 0) {
      Mapping::~Mapping((Mapping *)((long)&key.field_2 + 8));
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Expected<Mapping, std::string> readMapping() {
		Mapping mapping;
		for (;;) {
			std::string key;
			{
				auto event_result = getNextEvent();
				if (!event_result)
					return Unexpected("Error while reading mapping: " + event_result.error());
				YamlEvent event = std::move(event_result).value();

				switch (event.type) {
					case YAML_SCALAR_EVENT:
						MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
						key = std::move(event.value);
						break;
					case YAML_MAPPING_END_EVENT:
						MSG("YAML_MAPPING_END_EVENT");
						return mapping;
					default:
						return Unexpected(format("Unexpected event %d", event.type));
					}
			}

			{
				auto event_result = getNextEvent();
				if (!event_result)
					return Unexpected("Error while reading mapping: " + event_result.error());
				YamlEvent event = std::move(event_result).value();

				switch (event.type) {
					case YAML_SCALAR_EVENT:
						MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
						mapping.map_.emplace(std::move(key), std::move(event.value));
						break;
					case YAML_SEQUENCE_START_EVENT:
						MSG("YAML_SEQUENCE_START_EVENT");
						{
							auto result = readSequence();
							if (!result)
								return Unexpected(result.error());
							mapping.map_.emplace(std::move(key), std::move(result).value());
						}
						break;
					case YAML_MAPPING_START_EVENT:
						MSG("YAML_MAPPING_START_EVENT");
						{
							auto result = readMapping();
							if (!result)
								return Unexpected(result.error());
							mapping.map_.emplace(std::move(key), std::move(result).value());
						}
						break;
					default:
						return Unexpected(format("Unexpected event %d", event.type));
				}
			}
		}
	}